

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.cpp
# Opt level: O2

atom * arc::vector_to_atom(atom *__return_storage_ptr__,
                          vector<arc::atom,_std::allocator<arc::atom>_> *a,int start)

{
  int iVar1;
  atom local_50;
  
  atom::atom(__return_storage_ptr__,(atom *)nil);
  iVar1 = (int)((ulong)((long)(a->super__Vector_base<arc::atom,_std::allocator<arc::atom>_>)._M_impl
                              .super__Vector_impl_data._M_finish -
                       (long)(a->super__Vector_base<arc::atom,_std::allocator<arc::atom>_>)._M_impl.
                             super__Vector_impl_data._M_start) >> 5);
  while (iVar1 = iVar1 + -1, start <= iVar1) {
    make_cons(&local_50,
              (a->super__Vector_base<arc::atom,_std::allocator<arc::atom>_>)._M_impl.
              super__Vector_impl_data._M_start + iVar1,__return_storage_ptr__);
    atom::operator=(__return_storage_ptr__,&local_50);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                         *)&local_50.val);
  }
  return __return_storage_ptr__;
}

Assistant:

atom vector_to_atom(const vector<atom>& a, int start) {
		atom r = nil;
		int i;
		for (i = a.size() - 1; i >= start; i--) {
			r = make_cons(a[i], r);
		}
		return r;
	}